

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

RuleInfo * __thiscall
anon_unknown.dwarf_246d29::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyType *key)

{
  KeyID keyID_00;
  iterator iVar1;
  pointer *__ptr;
  RuleInfo *pRVar2;
  KeyID keyID;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_38;
  key_type local_30;
  undefined4 extraout_var;
  
  keyID_00._value._0_4_ = (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[2])();
  keyID_00._value._4_4_ = extraout_var;
  local_30._value = keyID_00._value;
  iVar1 = std::
          unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
          ::find(&this->ruleInfos,&local_30);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*this->delegate->_vptr_BuildEngineDelegate[3])(&local_38,this->delegate,key);
    pRVar2 = addRule(this,keyID_00,&local_38);
    if (local_38._M_t.
        super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>._M_t.
        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
        super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl + 8))
                ();
    }
  }
  else {
    pRVar2 = (RuleInfo *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                    ._M_cur + 0x10);
  }
  return pRVar2;
}

Assistant:

RuleInfo& getRuleInfoForKey(const KeyType& key) {
    auto keyID = getKeyID(key);

    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, request it from the delegate and add it.
    return addRule(keyID, delegate.lookupRule(key));
  }